

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByCamelcaseName
          (FileDescriptor *this,string_view name)

{
  bool bVar1;
  FieldDescriptor *result;
  FileDescriptor *this_local;
  string_view name_local;
  
  name_local._M_str =
       (char *)FileDescriptorTables::FindFieldByCamelcaseName(this->tables_,this,name);
  if (((FieldDescriptor *)name_local._M_str == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)name_local._M_str), !bVar1)) {
    name_local._M_str = (char *)0x0;
  }
  return (FieldDescriptor *)name_local._M_str;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByCamelcaseName(
    absl::string_view name) const {
  const FieldDescriptor* result = tables_->FindFieldByCamelcaseName(this, name);
  if (result == nullptr || !result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}